

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::log_internal::LogMessage::OstreamView::~OstreamView(OstreamView *this)

{
  Span<char> *buf;
  size_type *psVar1;
  ulong uVar2;
  LogMessageData *this_00;
  size_type sVar3;
  ulong uVar4;
  undefined8 extraout_RAX;
  LogMessageData *pLVar5;
  LogMessageData *this_01;
  Span<char> msg;
  
  std::ios::rdbuf((streambuf *)
                  (&this->data_->manipulated + *(long *)(*(long *)&this->data_->manipulated + -0x18)
                  ));
  pLVar5 = (LogMessageData *)(this->string_start_).ptr_;
  if (pLVar5 == (LogMessageData *)0x0) {
    this_00 = this->data_;
    this_01 = this_00;
    if ((this_00->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
      (this_00->encoded_remaining_actual_do_not_use_directly).ptr_ = (this_00->encoded_buf)._M_elems
      ;
      (this_00->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
      pLVar5 = this_00;
      LogMessageData::InitializeEncodingAndFormat(this_00);
      this_01 = this->data_;
      if ((this_01->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
        (this_01->encoded_remaining_actual_do_not_use_directly).ptr_ =
             (this_01->encoded_buf)._M_elems;
        (this_01->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
        pLVar5 = this_01;
        LogMessageData::InitializeEncodingAndFormat(this_01);
      }
    }
    uVar4 = (this_00->encoded_remaining_actual_do_not_use_directly).len_;
    psVar1 = &(this_01->encoded_remaining_actual_do_not_use_directly).len_;
    if (uVar4 < *psVar1) {
LAB_0100b65d:
      ~OstreamView((OstreamView *)pLVar5);
      __clang_call_terminate(extraout_RAX);
    }
    (this_00->encoded_remaining_actual_do_not_use_directly).len_ = uVar4 - *psVar1;
  }
  else {
    uVar4 = *(long *)&this->field_0x28 - *(long *)&this->field_0x20;
    if (uVar4 != 0) {
      uVar2 = (this->encoded_remaining_copy_).len_;
      if (uVar2 < uVar4) {
        ~OstreamView((OstreamView *)pLVar5);
        goto LAB_0100b65d;
      }
      (this->encoded_remaining_copy_).ptr_ = (this->encoded_remaining_copy_).ptr_ + uVar4;
      buf = &this->encoded_remaining_copy_;
      (this->encoded_remaining_copy_).len_ = uVar2 - uVar4;
      msg.len_ = (this->string_start_).len_;
      msg.ptr_ = (pointer)pLVar5;
      EncodeMessageLength(msg,buf);
      EncodeMessageLength(this->message_start_,buf);
      pLVar5 = this->data_;
      if ((pLVar5->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
        (pLVar5->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar5->encoded_buf)._M_elems
        ;
        (pLVar5->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
        LogMessageData::InitializeEncodingAndFormat(pLVar5);
      }
      sVar3 = (this->encoded_remaining_copy_).len_;
      (pLVar5->encoded_remaining_actual_do_not_use_directly).ptr_ = buf->ptr_;
      (pLVar5->encoded_remaining_actual_do_not_use_directly).len_ = sVar3;
    }
  }
  *(code **)this = std::__cxx11::string::compare;
  std::locale::~locale((locale *)&this->field_0x38);
  return;
}

Assistant:

LogMessage::OstreamView::~OstreamView() {
  data_.manipulated.rdbuf(nullptr);
  if (!string_start_.data()) {
    // The second field header didn't fit.  Whether the first one did or not, we
    // shouldn't commit `encoded_remaining_copy_`, and we also need to zero the
    // size of `data_->encoded_remaining()` so that no more data are encoded.
    data_.encoded_remaining().remove_suffix(data_.encoded_remaining().size());
    return;
  }
  const absl::Span<const char> contents(pbase(),
                                        static_cast<size_t>(pptr() - pbase()));
  if (contents.empty()) return;
  encoded_remaining_copy_.remove_prefix(contents.size());
  EncodeMessageLength(string_start_, &encoded_remaining_copy_);
  EncodeMessageLength(message_start_, &encoded_remaining_copy_);
  data_.encoded_remaining() = encoded_remaining_copy_;
}